

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_mt.cpp
# Opt level: O2

void do_work(void)

{
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
  *psVar1;
  rep rVar2;
  _Elt_pointer piVar3;
  int iVar4;
  bool bVar5;
  allocator<char> local_fa;
  allocator<char> local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  inline_timer local_78;
  
  psVar1 = perf::inline_timer_stack();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/example/inline_mt.cpp"
             ,&local_f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"do_work",&local_fa);
  perf::inline_timer::inline_timer(&local_78,&local_98,0x24,&local_b8);
  std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>::
  emplace_back<perf::inline_timer>(&psVar1->c,&local_78);
  perf::inline_timer::~inline_timer(&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  psVar1 = perf::inline_timer_stack();
  piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (psVar1->c).
                super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  rVar2 = std::chrono::_V2::system_clock::now();
  piVar3[-1].m_start.__d.__r = rVar2;
  local_78._0_8_ = 0x14;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&local_78);
  psVar1 = perf::inline_timer_stack();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/example/inline_mt.cpp"
             ,&local_f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"do_work",&local_fa);
  perf::inline_timer::inline_timer(&local_78,&local_d8,0x27,&local_f8);
  std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>::
  emplace_back<perf::inline_timer>(&psVar1->c,&local_78);
  perf::inline_timer::~inline_timer(&local_78);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  psVar1 = perf::inline_timer_stack();
  piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (psVar1->c).
                super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  rVar2 = std::chrono::_V2::system_clock::now();
  piVar3[-1].m_start.__d.__r = rVar2;
  iVar4 = 10;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    local_78._0_8_ = 0x14;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_78);
  }
  psVar1 = perf::inline_timer_stack();
  piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (psVar1->c).
                super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  rVar2 = std::chrono::_V2::system_clock::now();
  piVar3[-1].m_stop.__d.__r = rVar2;
  psVar1 = perf::inline_timer_stack();
  piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (psVar1->c).
                super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  if (piVar3[-1].m_first_line < 0x2c) {
    piVar3[-1].m_last_line = 0x2c;
  }
  psVar1 = perf::inline_timer_stack();
  piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (psVar1->c).
                super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  perf::operator<<((ostream *)&std::cout,piVar3 + -1);
  std::operator<<((ostream *)&std::cout,'\n');
  psVar1 = perf::inline_timer_stack();
  std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>::pop_back(&psVar1->c);
  psVar1 = perf::inline_timer_stack();
  piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (psVar1->c).
                super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  rVar2 = std::chrono::_V2::system_clock::now();
  piVar3[-1].m_stop.__d.__r = rVar2;
  psVar1 = perf::inline_timer_stack();
  piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (psVar1->c).
                super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  if (piVar3[-1].m_first_line < 0x2e) {
    piVar3[-1].m_last_line = 0x2e;
  }
  psVar1 = perf::inline_timer_stack();
  piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (psVar1->c).
                super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (psVar1->c).super__Deque_base<perf::inline_timer,_std::allocator<perf::inline_timer>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  perf::operator<<((ostream *)&std::cout,piVar3 + -1);
  std::operator<<((ostream *)&std::cout,'\n');
  psVar1 = perf::inline_timer_stack();
  std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>::pop_back(&psVar1->c);
  return;
}

Assistant:

void do_work()
{
    PERF_START();
    std::this_thread::sleep_for(perf::milliseconds(20));

    PERF_START();
    for (int i = 0; i < 10; i++)
    {
        std::this_thread::sleep_for(perf::milliseconds(20));
    }
    PERF_STOP();

    PERF_STOP();
}